

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ap_str.c
# Opt level: O0

size_t ap_str_strlcat(char *dst,char *src,size_t size)

{
  long lVar1;
  size_t sVar2;
  bool bVar3;
  size_t dlen;
  size_t n;
  char *s;
  char *d;
  size_t size_local;
  char *src_local;
  char *dst_local;
  
  dlen = size;
  s = dst;
  while( true ) {
    bVar3 = false;
    if (dlen != 0) {
      bVar3 = *s != '\0';
    }
    if (!bVar3) break;
    s = s + 1;
    dlen = dlen - 1;
  }
  lVar1 = (long)s - (long)dst;
  dlen = size - lVar1;
  n = (size_t)src;
  if (dlen == 0) {
    sVar2 = strlen(src);
  }
  else {
    for (; *(char *)n != '\0'; n = n + 1) {
      if (dlen != 1) {
        *s = *(char *)n;
        dlen = dlen - 1;
        s = s + 1;
      }
    }
    *s = '\0';
    sVar2 = n - (long)src;
  }
  dst_local = (char *)(lVar1 + sVar2);
  return (size_t)dst_local;
}

Assistant:

size_t ap_str_strlcat (char *dst, const char *src, size_t size)
{
	char		*d		= dst;
	const char	*s		= src;
	size_t		n		= size;
	size_t		dlen;

	/* Find the end of dst and adjust bytes left but don't go past end */
	while (n-- != 0 && *d != '\0')
	{
		d++;
	}

	dlen = d - dst;
	n = size - dlen;

	if (n == 0)
	{
		return (dlen + strlen (s));
	}
	
	while (*s != '\0')
	{
		if (n != 1)
		{
			*d++ = *s;
			n--;
		}
		
		s++;
	}
	
	*d = '\0';

	return (dlen + (s - src)); /* count does not include NUL */
}